

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double __thiscall
Alg::opimb_fast_end(Alg *this,Graph *graph,double budget,
                   vector<double,_std::allocator<double>_> *budget_list,double epsilon,double feps,
                   double delta,string *model,string *graphname,int mode)

{
  byte bVar1;
  uint uVar2;
  TResult *pTVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  char cVar11;
  int iVar12;
  ostream *poVar13;
  long lVar14;
  long lVar15;
  long *plVar16;
  undefined8 *puVar17;
  ulong uVar18;
  long *plVar19;
  ulong *puVar20;
  size_t numSamples;
  Graph *graph_00;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double timeb;
  time_t now;
  ofstream outfile;
  double local_520;
  double local_4f8;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  double local_4c8;
  undefined8 uStack_4c0;
  long *local_4b0;
  undefined8 local_4a8;
  long local_4a0;
  undefined8 uStack_498;
  long *local_490;
  undefined8 local_488;
  long local_480;
  undefined8 uStack_478;
  double local_470;
  double local_468;
  double local_460;
  vector<double,_std::allocator<double>_> *local_458;
  double local_450;
  double local_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  ulong *local_420;
  long local_418;
  ulong local_410;
  long lStack_408;
  double local_400;
  int local_3f4;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  ulong *local_390;
  long local_388;
  ulong local_380;
  long lStack_378;
  ulong local_370;
  double local_368;
  Nodelist *local_360;
  double local_358;
  HyperGraph *local_350;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  undefined1 local_308 [16];
  string *local_2f8;
  string *local_2f0;
  Nodelist *local_2e8;
  Nodelist *local_2e0;
  long local_2d8;
  double local_2d0;
  long local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  HyperGraph *local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  time_t local_288;
  vector<double,_std::allocator<double>_> local_280;
  vector<double,_std::allocator<double>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_470 = epsilon;
  local_460 = budget;
  local_458 = budget_list;
  local_450 = feps;
  local_2f8 = graphname;
  local_2f0 = model;
  local_2d8 = std::chrono::_V2::system_clock::now();
  std::ofstream::ofstream(&local_230);
  if (ABS(local_450 + -0.01) <= 1e-06) {
    dVar24 = 0.437888;
  }
  else if (ABS(local_450 + -0.05) <= 1e-06) {
    dVar24 = 0.435641;
  }
  else if (ABS(local_450 + -0.1) <= 1e-06) {
    dVar24 = 0.432857;
  }
  else if (ABS(local_450 + -0.15) <= 1e-06) {
    dVar24 = 0.430099;
  }
  else {
    if (1e-06 < ABS(local_450 + -0.2)) {
      puVar17 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar17 = "feps error!";
      __cxa_throw(puVar17,&char_const*::typeinfo,0);
    }
    dVar24 = 0.427369;
  }
  dVar24 = exp((1.0 - local_450) * dVar24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Approx: ",8);
  dVar24 = 1.0 - 1.0 / dVar24;
  poVar13 = std::ostream::_M_insert<double>(dVar24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  dVar27 = 6.0 / delta;
  dVar5 = log(dVar27);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_268,local_458);
  iVar12 = cal_k_max(&local_268,local_460);
  if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_280,local_458);
  cal_k_min(&local_280,local_460);
  if (local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  dVar26 = (double)this->__numV;
  local_4c8 = dVar26 + dVar26;
  uStack_4c0 = 0;
  dVar25 = (double)iVar12;
  dVar26 = log(dVar26);
  dVar6 = log(dVar27);
  dVar26 = (dVar26 * dVar25 + dVar6) * dVar24;
  if (dVar26 < 0.0) {
    dVar26 = sqrt(dVar26);
  }
  else {
    dVar26 = SQRT(dVar26);
  }
  dVar26 = dVar26 + dVar5 * dVar24;
  dVar6 = (double)this->__numV;
  dVar26 = (local_4c8 * dVar26 * dVar26) / dVar6;
  local_370 = (ulong)dVar26;
  local_370 = (long)(dVar26 - 9.223372036854776e+18) & (long)local_370 >> 0x3f | local_370;
  local_4c8 = dVar6 + dVar6;
  uStack_4c0 = 0;
  dVar26 = log(dVar6);
  dVar27 = log(dVar27);
  dVar27 = (dVar26 * dVar25 + dVar27) * dVar24;
  if (dVar27 < 0.0) {
    dVar27 = sqrt(dVar27);
  }
  else {
    dVar27 = SQRT(dVar27);
  }
  dVar27 = dVar5 * dVar24 + dVar27;
  dVar27 = (local_4c8 * dVar27 * dVar27) / (local_470 * local_470 * dVar25);
  uVar18 = (ulong)dVar27;
  bVar10 = 0;
  uVar18 = ((long)(dVar27 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) / local_370;
  auVar28._8_4_ = (int)(uVar18 >> 0x20);
  auVar28._0_8_ = uVar18;
  auVar28._12_4_ = 0x45300000;
  dVar27 = log((auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0));
  uVar18 = (ulong)(dVar27 / 0.6931471805599453);
  local_2c8 = ((long)(dVar27 / 0.6931471805599453 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f |
              uVar18) + 1;
  auVar29._8_4_ = (int)((ulong)local_2c8 >> 0x20);
  auVar29._0_8_ = local_2c8;
  auVar29._12_4_ = 0x45300000;
  dVar27 = (((auVar29._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_2c8) - 4503599627370496.0)) * 3.0) / delta;
  local_468 = log(dVar27);
  local_448 = log(dVar27);
  local_400 = 0.0;
  local_2a8 = &this->__hyperG;
  local_350 = &this->__hyperGVldt;
  local_360 = &this->__vecSeed;
  local_2b0 = (local_468 + local_468) / 9.0;
  local_368 = local_468 * 0.5;
  local_468 = local_468 / 18.0;
  local_448 = local_448 * 0.5;
  local_2d0 = dVar24 - local_470;
  local_2e0 = &this->__vecSeed_inf;
  local_2e8 = &this->__vecSeed_inf_cost;
  local_2b8 = SQRT(local_368);
  local_2c0 = SQRT(local_448);
  local_520 = 0.0;
  local_4c8 = 0.0;
  bVar7 = false;
  local_3f4 = mode;
  do {
    iVar12 = local_3f4;
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    numSamples = local_370 << (bVar10 & 0x3f);
    lVar14 = std::chrono::_V2::system_clock::now();
    HyperGraph::build_n_RRsets(local_2a8,numSamples);
    HyperGraph::build_n_RRsets(local_350,numSamples);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# RR sets: ",0xb);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    cVar11 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    graph_00 = (Graph *)(ulong)(uint)(int)cVar11;
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    this->__numRRsets = (this->__hyperG).__numRRsets;
    lVar15 = std::chrono::_V2::system_clock::now();
    local_290 = (double)(lVar15 - lVar14) / 1000000000.0;
    dVar27 = max_cover_lazy_budget_fast_end
                       (this,graph_00,local_460,local_458,local_450,&local_400,iVar12);
    lVar14 = std::chrono::_V2::system_clock::now();
    local_298 = (double)(lVar14 - lVar15) / 1000000000.0;
    dVar5 = HyperGraph::self_inf_cal(local_350,local_360);
    dVar26 = (double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25;
    local_308._8_4_ = SUB84(dVar26,0);
    local_308._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0;
    local_308._12_4_ = (int)((ulong)dVar26 >> 0x20);
    dVar26 = dVar27 / dVar24;
    if ((iVar12 == 2) || (dVar6 = dVar27, iVar12 == 1)) {
      if (this->__is_inf_cost == true) {
        dVar6 = dVar26;
        if (this->__boundMin_inf_cost <= dVar26) {
          dVar6 = this->__boundMin_inf_cost;
        }
      }
      else {
        dVar6 = this->__boundMin_inf;
      }
    }
    uVar2 = this->__numV;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"========upper bound ratio: ",0x1b);
    poVar13 = std::ostream::_M_insert<double>(dVar6 / dVar26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"========",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    dVar26 = (((double)local_308._8_8_ + (double)local_308._0_8_) * dVar5) / (double)uVar2 +
             local_2b0;
    auVar30._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar30._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar30._12_4_ = 0x45300000;
    uVar2 = this->__numV;
    if (dVar26 < 0.0) {
      dVar26 = sqrt(dVar26);
    }
    else {
      dVar26 = SQRT(dVar26);
    }
    local_308._0_8_ = dVar26;
    uVar22 = SUB84(local_2b8,0);
    uVar23 = (undefined4)((ulong)local_2b8 >> 0x20);
    if (local_368 < 0.0) {
      dVar26 = sqrt(local_368);
      uVar22 = SUB84(dVar26,0);
      uVar23 = (undefined4)((ulong)dVar26 >> 0x20);
    }
    local_2a0 = (double)CONCAT44(uVar23,uVar22);
    dVar26 = (((auVar30._8_8_ - 1.9342813113834067e+25) + (auVar30._0_8_ - 4503599627370496.0)) *
             dVar6) / (double)uVar2 + local_448;
    if (dVar26 < 0.0) {
      local_358 = sqrt(dVar26);
    }
    else {
      local_358 = SQRT(dVar26);
    }
    local_4f8 = local_2c0;
    if (local_448 < 0.0) {
      local_4f8 = sqrt(local_448);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-B-FAST-END (",0x15);
    bVar1 = bVar10 + 1;
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"/",1);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,") approx. (max-cover): ",0x17);
    dVar25 = ((double)local_308._0_8_ - local_2a0) * ((double)local_308._0_8_ - local_2a0) -
             local_468;
    dVar26 = 0.0;
    if (0.0 <= dVar25) {
      dVar26 = dVar25;
    }
    dVar26 = dVar26 / ((local_358 + local_4f8) * (local_358 + local_4f8));
    poVar13 = std::ostream::_M_insert<double>(dVar26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," (",2);
    poVar13 = std::ostream::_M_insert<double>(dVar27 / dVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"), #RR sets: ",0xd);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    local_4e8 = (long *)CONCAT71(local_4e8._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4e8,1);
    local_4c8 = local_4c8 + local_290;
    local_520 = local_520 + local_298;
    bVar4 = dVar26 < local_2d0;
    bVar8 = !bVar7;
    if (bVar8 || bVar4) {
      bVar9 = bVar7;
      if (!bVar7) {
        bVar9 = true;
      }
      bVar10 = bVar1;
      if (local_2d0 <= dVar26) {
        bVar7 = bVar9;
      }
    }
    else {
      pTVar3 = this->__tRes;
      pTVar3->__Approx = dVar26;
      lVar14 = std::chrono::_V2::system_clock::now();
      pTVar3->__RunningTime = (double)(lVar14 - local_2d8) / 1000000000.0;
      pTVar3 = this->__tRes;
      pTVar3->__Influence = dVar5;
      pTVar3->__InfluenceOriginal = dVar27;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&pTVar3->__VecSeed,local_360);
      pTVar3->__SeedSize =
           (int)((ulong)((long)(this->__vecSeed).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->__vecSeed).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->__tRes->__VecSeed_inf,local_2e0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->__tRes->__VecSeed_inf_cost,local_2e8);
      pTVar3 = this->__tRes;
      pTVar3->__BoundMin_inf = this->__boundMin_inf;
      pTVar3->__BoundMin_inf_cost = this->__boundMin_inf_cost;
      pTVar3->__RRsetsSize = this->__numRRsets * 2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
      poVar13 = std::ostream::_M_insert<double>(dVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", time: ",8);
      poVar13 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
      local_4e8._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4e8,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
      poVar13 = std::ostream::_M_insert<double>(local_4c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      dVar6 = local_400;
      poVar13 = std::ostream::_M_insert<double>(local_520 - local_400);
      local_4e8._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4e8,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
      poVar13 = std::ostream::_M_insert<double>(dVar6);
      local_4e8 = (long *)CONCAT71(local_4e8._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4e8,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Seed size: ",0xb);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      local_288 = time((time_t *)0x0);
      ctime(&local_288);
      std::operator+(&local_250,"fast/",local_2f0);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_440 = &local_430;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        local_430 = *plVar19;
        lStack_428 = plVar16[3];
      }
      else {
        local_430 = *plVar19;
        local_440 = (long *)*plVar16;
      }
      local_438 = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_440,(ulong)(local_2f8->_M_dataplus)._M_p);
      local_3f0 = &local_3e0;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        local_3e0 = *plVar19;
        lStack_3d8 = plVar16[3];
      }
      else {
        local_3e0 = *plVar19;
        local_3f0 = (long *)*plVar16;
      }
      local_3e8 = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_3f0);
      puVar20 = (ulong *)(plVar16 + 2);
      if ((ulong *)*plVar16 == puVar20) {
        local_380 = *puVar20;
        lStack_378 = plVar16[3];
        local_390 = &local_380;
      }
      else {
        local_380 = *puVar20;
        local_390 = (ulong *)*plVar16;
      }
      local_388 = plVar16[1];
      *plVar16 = (long)puVar20;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_3b0,vsnprintf,0x148,"%f",SUB84(local_470,0));
      uVar18 = 0xf;
      if (local_390 != &local_380) {
        uVar18 = local_380;
      }
      if (uVar18 < local_3b0._M_string_length + local_388) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          uVar21 = local_3b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_3b0._M_string_length + local_388) goto LAB_0010eaa4;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_390);
      }
      else {
LAB_0010eaa4:
        puVar17 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_390,(ulong)local_3b0._M_dataplus._M_p);
      }
      local_4b0 = &local_4a0;
      plVar16 = puVar17 + 2;
      if ((long *)*puVar17 == plVar16) {
        local_4a0 = *plVar16;
        uStack_498 = puVar17[3];
      }
      else {
        local_4a0 = *plVar16;
        local_4b0 = (long *)*puVar17;
      }
      local_4a8 = puVar17[1];
      *puVar17 = plVar16;
      puVar17[1] = 0;
      *(undefined1 *)plVar16 = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_4b0);
      local_420 = &local_410;
      puVar20 = (ulong *)(plVar16 + 2);
      if ((ulong *)*plVar16 == puVar20) {
        local_410 = *puVar20;
        lStack_408 = plVar16[3];
      }
      else {
        local_410 = *puVar20;
        local_420 = (ulong *)*plVar16;
      }
      local_418 = plVar16[1];
      *plVar16 = (long)puVar20;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_3d0,vsnprintf,0x148,"%f",SUB84(local_450,0));
      uVar18 = 0xf;
      if (local_420 != &local_410) {
        uVar18 = local_410;
      }
      if (uVar18 < local_3d0._M_string_length + local_418) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          uVar21 = local_3d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_3d0._M_string_length + local_418) goto LAB_0010ec1a;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_420);
      }
      else {
LAB_0010ec1a:
        puVar17 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_420,(ulong)local_3d0._M_dataplus._M_p);
      }
      local_490 = &local_480;
      plVar16 = puVar17 + 2;
      if ((long *)*puVar17 == plVar16) {
        local_480 = *plVar16;
        uStack_478 = puVar17[3];
      }
      else {
        local_480 = *plVar16;
        local_490 = (long *)*puVar17;
      }
      local_488 = puVar17[1];
      *puVar17 = plVar16;
      puVar17[1] = 0;
      *(undefined1 *)plVar16 = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_490);
      local_348 = &local_338;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        local_338 = *plVar19;
        lStack_330 = plVar16[3];
      }
      else {
        local_338 = *plVar19;
        local_348 = (long *)*plVar16;
      }
      local_340 = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_328 = &local_318;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        local_318 = *plVar19;
        lStack_310 = plVar16[3];
      }
      else {
        local_318 = *plVar19;
        local_328 = (long *)*plVar16;
      }
      local_320 = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_328);
      local_4e8 = &local_4d8;
      plVar19 = plVar16 + 2;
      if ((long *)*plVar16 == plVar19) {
        local_4d8 = *plVar19;
        lStack_4d0 = plVar16[3];
      }
      else {
        local_4d8 = *plVar19;
        local_4e8 = (long *)*plVar16;
      }
      local_4e0 = plVar16[1];
      *plVar16 = (long)plVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_4e8);
      if (local_4e8 != &local_4d8) {
        operator_delete(local_4e8,local_4d8 + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if (local_490 != &local_480) {
        operator_delete(local_490,local_480 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
      if (local_420 != &local_410) {
        operator_delete(local_420,local_410 + 1);
      }
      if (local_4b0 != &local_4a0) {
        operator_delete(local_4b0,local_4a0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if (local_390 != &local_380) {
        operator_delete(local_390,local_380 + 1);
      }
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,local_3e0 + 1);
      }
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      poVar13 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      poVar13 = std::ostream::_M_insert<double>(dVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      poVar13 = std::ostream::_M_insert<double>(dVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      poVar13 = std::ostream::_M_insert<double>(dVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      poVar13 = std::ostream::_M_insert<double>(local_4c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      dVar27 = local_400;
      poVar13 = std::ostream::_M_insert<double>(local_400);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,",",1);
      std::ostream::_M_insert<double>(local_520 - dVar27);
      bVar7 = true;
    }
    if (!bVar8 && !bVar4) {
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      return 0.0;
    }
  } while( true );
}

Assistant:

double Alg::opimb_fast_end(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double feps, const double delta, const std::string model,
        std::string graphname, const int mode) {
    Timer timerOPIMC("OPIM-B-FAST-END");
    std::ofstream outfile;
    double e_alpha;
    if (fabs(feps - 0.01) <= 0.000001) {
        e_alpha = exp(0.437888 * (1 - feps));
    }
    else if (fabs(feps - 0.05) <= 0.000001) {
        e_alpha = exp(0.435641 * (1 - feps));
    }
    else if (fabs(feps - 0.1) <= 0.000001) {
        e_alpha = exp(0.432857 * (1 - feps));
    }
    else if (fabs(feps - 0.15) <= 0.000001) {
        e_alpha = exp(0.430099 * (1 - feps));
    }
    else if (fabs(feps - 0.2) <= 0.000001) {
        e_alpha = exp(0.427369 * (1 - feps));
    }
    else {
        throw "feps error!";
    }
    const double approx = 1 - 1.0 / e_alpha;
    std::cout << "Approx: " << approx << std::endl;
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2((1 - 1 / e_alpha) * alpha
            + sqrt((1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2((1 - 1 / e_alpha) * alpha
            + sqrt((1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    int satisfy_count = 0;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget_fast_end(graph, budget, budget_list, feps, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf;
        auto upperBound_med = infSelf / approx;
        if (mode == 1) {
//            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        std::cout << "========upper bound ratio: " << upperBound / upperBound_med << "========" << std::endl;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-FAST-END (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
            approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx - epsilon && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            std::cout << "Seed size: " << __vecSeed.size() << std::endl;
            time_t now = time(0);
            char* dt = ctime(&now);
            outfile.open("fast/" + model + "_" + graphname + "_" + std::to_string(epsilon) + "_" + std::to_string(feps)
                         + "_" + dt + ".txt");
            outfile << __tRes.get_running_time() << "," << "," << __numRRsets * 2 << "," <<
            infVldt << "," << "," << infSelf << "," << "," << __vecSeed.size() << "," <<
            approxOPIMC << "," << "," << time1 << "," << timeb << "," << time2 - timeb;
            return 0;
        }
        else if (approxOPIMC >= approx - epsilon && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}